

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Vec3fa __thiscall embree::cosineSampleHemisphere(embree *this,Vec2f *s)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec3fa VVar6;
  
  fVar5 = (s->field_0).field_0.x;
  fVar2 = (s->field_0).field_0.y;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar5 = fVar5 * 6.2831855;
  fVar3 = 1.0 - (s->field_0).field_0.y;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar4 = sinf(fVar5);
  fVar5 = cosf(fVar5);
  VVar6.field_0._0_4_ = fVar5 * fVar3;
  VVar6.field_0._4_4_ = fVar4 * fVar3;
  auVar1._4_4_ = VVar6.field_0._4_4_;
  auVar1._0_4_ = VVar6.field_0._0_4_;
  auVar1._8_4_ = fVar2;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])this = auVar1;
  VVar6.field_0._8_8_ = 0;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

inline Vec3fa cosineSampleHemisphere(const Vec2f s)
{
  const float phi = 2.0f * float(M_PI) * s.x;
  const float cosTheta = sqrt(s.y);
  const float sinTheta = sqrt(1.0f - s.y);
  return cartesian(phi, sinTheta, cosTheta);
}